

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O1

RefcountedTemplate * __thiscall
ctemplate::TemplateCache::GetTemplateLocked
          (TemplateCache *this,TemplateString *filename,Strip strip,
          TemplateCacheKey *template_cache_key)

{
  bool bVar1;
  int iVar2;
  TemplateState TVar3;
  iterator iVar4;
  Template *pTVar5;
  mapped_type *pmVar6;
  char *pcVar7;
  time_t mtime;
  string resolved;
  FileStat statbuf;
  CachedTemplate local_100;
  string local_f0;
  undefined1 local_d0 [160];
  
  local_d0._0_8_ = template_cache_key->first;
  local_d0._8_4_ = template_cache_key->second;
  iVar4 = std::
          _Hashtable<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->parsed_template_cache_->_M_h,(key_type *)local_d0);
  pmVar6 = (mapped_type *)
           ((long)iVar4.
                  super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
                  ._M_cur + 0x18);
  if (iVar4.
      super__Node_iterator_base<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_true>
      ._M_cur == (__node_type *)0x0) {
    if (this->is_frozen_ != false) {
      return (RefcountedTemplate *)0x0;
    }
    pTVar5 = (Template *)operator_new(0xc0);
    Template::Template(pTVar5,filename,strip,this);
    pmVar6 = std::__detail::
             _Map_base<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::pair<unsigned_long,_int>,_std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_long,_int>_>,_ctemplate::TemplateCache::TemplateCacheHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)this->parsed_template_cache_,template_cache_key);
    CachedTemplate::CachedTemplate((CachedTemplate *)local_d0,pTVar5,FILE_BASED);
    pmVar6->refcounted_tpl = (RefcountedTemplate *)local_d0._0_8_;
    pmVar6->should_reload = (bool)(char)local_d0._8_4_;
    *(int3 *)&pmVar6->field_0x9 = SUB43(local_d0._8_4_,1);
    pmVar6->template_type = local_d0._12_4_;
  }
  if (pmVar6->should_reload != true) goto LAB_001214a1;
  pcVar7 = Template::original_filename(pmVar6->refcounted_tpl->ptr_);
  std::__cxx11::string::string((string *)local_d0,pcVar7,(allocator *)&local_100);
  FindTemplateFilename(&local_f0,this,(string *)local_d0);
  if ((RefcountedTemplate *)local_d0._0_8_ != (RefcountedTemplate *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_);
  }
  if (pmVar6->template_type == FILE_BASED) {
    Template::template_file(pmVar6->refcounted_tpl->ptr_);
    iVar2 = std::__cxx11::string::compare((char *)&local_f0);
    if (iVar2 == 0) {
      pcVar7 = Template::template_file(pmVar6->refcounted_tpl->ptr_);
      mtime = Template::mtime(pmVar6->refcounted_tpl->ptr_);
      bVar1 = HasTemplateChangedOnDisk(pcVar7,mtime,(FileStat *)local_d0);
      if (!bVar1) goto LAB_0012148a;
    }
    pTVar5 = (Template *)operator_new(0xc0);
    Template::Template(pTVar5,filename,strip,this);
    RefcountedTemplate::DecRefN(pmVar6->refcounted_tpl,1);
    CachedTemplate::CachedTemplate(&local_100,pTVar5,FILE_BASED);
    pmVar6->refcounted_tpl = local_100.refcounted_tpl;
    pmVar6->should_reload = local_100.should_reload;
    *(undefined3 *)&pmVar6->field_0x9 = local_100._9_3_;
    pmVar6->template_type = local_100.template_type;
  }
LAB_0012148a:
  pmVar6->should_reload = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
LAB_001214a1:
  TVar3 = Template::state(pmVar6->refcounted_tpl->ptr_);
  if (TVar3 != TS_READY) {
    return (RefcountedTemplate *)0x0;
  }
  return pmVar6->refcounted_tpl;
}

Assistant:

TemplateCache::RefcountedTemplate* TemplateCache::GetTemplateLocked(
    const TemplateString& filename,
    Strip strip,
    const TemplateCacheKey& template_cache_key) {
  // NOTE: A write-lock must be held on mutex_ when this method is called.
  CachedTemplate* it = find_ptr(*parsed_template_cache_, template_cache_key);
  if (!it) {
    // If the cache is frozen and the template doesn't already exist in cache,
    // do not load the template, return NULL.
    if (is_frozen_) {
      return NULL;
    }
    // TODO(panicker): Validate the filename here, and if the file can't be
    // resolved then insert a NULL in the cache.
    // If validation succeeds then pass in resolved filename, mtime &
    // file length (from statbuf) to the constructor.
    const Template* tpl = new Template(filename, strip, this);
    it = &(*parsed_template_cache_)[template_cache_key];
    *it = CachedTemplate(tpl, CachedTemplate::FILE_BASED);
    assert(it);
  }
  if (it->should_reload) {
    // check if the template has changed on disk or if a new template with the
    // same name has been added earlier in the search path:
    const string resolved = FindTemplateFilename(
        it->refcounted_tpl->tpl()->original_filename());
    FileStat statbuf;
    if (it->template_type == CachedTemplate::FILE_BASED &&
        (resolved != it->refcounted_tpl->tpl()->template_file() ||
         HasTemplateChangedOnDisk(
             it->refcounted_tpl->tpl()->template_file(),
             it->refcounted_tpl->tpl()->mtime(),
             &statbuf))) {
      // Create a new template, insert it into the cache under
      // template_cache_key, and DecRef() the old one to indicate
      // the cache no longer has a reference to it.
      const Template* tpl = new Template(filename, strip, this);
      // DecRef after creating the new template since DecRef may free up
      // the storage for filename,
      it->refcounted_tpl->DecRef();
      *it = CachedTemplate(tpl, CachedTemplate::FILE_BASED);
    }
    it->should_reload = false;
  }

  // If the state is TS_ERROR, we leave the state as is, but return
  // NULL.  We won't try to load the template file again until the
  // reload status is set to true by another call to ReloadAllIfChanged.
  return it->refcounted_tpl->tpl()->state() == TS_READY ? it->refcounted_tpl : NULL;
}